

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,uint param_2)

{
  StrWriter *pSVar1;
  
  if (param_2 < 0x10) {
    pSVar1 = operator<<(this,&DAT_0033f850 + *(int *)(&DAT_0033f850 + (ulong)param_2 * 4));
    return pSVar1;
  }
  pSVar1 = operator<<(this,"?");
  return pSVar1;
}

Assistant:

StrWriter&
StrWriter::operator<<(Pcc pcc)
{
    switch (pcc.raw) {

        case 0:  *this << "bs"; break;
        case 1:  *this << "bc"; break;
        case 2:  *this << "ls"; break;
        case 3:  *this << "lc"; break;
        case 4:  *this << "ss"; break;
        case 5:  *this << "sc"; break;
        case 6:  *this << "as"; break;
        case 7:  *this << "ac"; break;
        case 8:  *this << "ws"; break;
        case 9:  *this << "wc"; break;
        case 10: *this << "is"; break;
        case 11: *this << "ic"; break;
        case 12: *this << "gs"; break;
        case 13: *this << "gc"; break;
        case 14: *this << "cs"; break;
        case 15: *this << "cc"; break;

        default:
            *this << "?";
    }
    return *this;
}